

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<cs::method_base*,std::allocator>::push<cs::method_base*&>
          (stack_type<cs::method_base_*,_std::allocator> *this,method_base **args)

{
  method_base **ppmVar1;
  bool bVar2;
  error *this_00;
  undefined8 *in_RSI;
  stack_type<cs::method_base_*,_std::allocator> *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [32];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  bVar2 = stack_type<cs::method_base_*,_std::allocator>::full(in_RDI);
  if (!bVar2) {
    ppmVar1 = in_RDI->m_current;
    in_RDI->m_current = ppmVar1 + 1;
    *ppmVar1 = (method_base *)*local_10;
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"E000I",&local_31);
  cov::error::error(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}